

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

void __thiscall QAbstractSpinBox::clear(QAbstractSpinBox *this)

{
  long lVar1;
  QLineEdit *this_00;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_QString_&> local_48;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  this_00 = *(QLineEdit **)(lVar1 + 0x378);
  local_48.a = (QString *)(lVar1 + 600);
  local_48.b = (QString *)(lVar1 + 0x270);
  QStringBuilder<QString_&,_QString_&>::convertTo<QString>((QString *)&local_38,&local_48);
  QLineEdit::setText(this_00,(QString *)&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  QLineEdit::setCursorPosition(*(QLineEdit **)(lVar1 + 0x378),*(int *)(lVar1 + 0x268));
  *(byte *)(lVar1 + 0x3d0) = *(byte *)(lVar1 + 0x3d0) | 0x80;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBox::clear()
{
    Q_D(QAbstractSpinBox);

    d->edit->setText(d->prefix + d->suffix);
    d->edit->setCursorPosition(d->prefix.size());
    d->cleared = true;
}